

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureBarrierTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::TextureBarrierBasicOutline::verifyTextureData(TextureBarrierBasicOutline *this)

{
  GLuint GVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  GLuint *pGVar4;
  uint local_2c;
  uint local_28;
  GLuint y;
  GLuint x;
  GLuint i;
  Functions *gl;
  TextureBarrierBasicOutline *this_local;
  
  pRVar3 = deqp::Context::getRenderContext
                     ((this->super_TextureBarrierBaseTest).super_TestCase.m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  y = 0;
  do {
    if (7 < y) {
      return true;
    }
    (**(code **)(CONCAT44(extraout_var,iVar2) + 8))(y + 0x84c0);
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0xaa0))(0xde1,0,0x8d94,0x1405,this->m_actual);
    for (local_28 = 0; local_28 < this->m_width; local_28 = local_28 + 1) {
      for (local_2c = 0; local_2c < this->m_height; local_2c = local_2c + 1) {
        pGVar4 = texel(this,this->m_reference[y],local_28,local_2c);
        GVar1 = *pGVar4;
        pGVar4 = texel(this,this->m_actual,local_28,local_2c);
        if (GVar1 != *pGVar4) {
          return false;
        }
      }
    }
    y = y + 1;
  } while( true );
}

Assistant:

bool verifyTextureData()
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		for (GLuint i = 0; i < NUM_TEXTURES; ++i)
		{
			gl.activeTexture(GL_TEXTURE0 + i);
			gl.getTexImage(GL_TEXTURE_2D, 0, GL_RED_INTEGER, GL_UNSIGNED_INT, m_actual);

			for (GLuint x = 0; x < m_width; ++x)
				for (GLuint y = 0; y < m_height; ++y)
				{
					if (texel(m_reference[i], x, y) != texel(m_actual, x, y))
					{
						return false;
					}
				}
		}

		return true;
	}